

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::
SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_10U>
::SmallVector(SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_10U>
              *this,SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_10U>
                    *RHS)

{
  bool bVar1;
  SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_10U>
  *RHS_local;
  SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed,_10U>
  *this_local;
  
  SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed>
  ::SmallVectorImpl(&this->
                     super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed>
                    ,10);
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)RHS);
  if (!bVar1) {
    SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed>
    ::operator=(&this->
                 super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed>
                ,&RHS->
                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<32U,_Fixpp::Type::Float>,_Fixpp::TagT<17U,_Fixpp::Type::String>,_Fixpp::TagT<31U,_Fixpp::Type::Float>,_Fixpp::TagT<29U,_Fixpp::Type::Char>_>::Unparsed>
               );
  }
  return;
}

Assistant:

SmallVector(SmallVector &&RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(::std::move(RHS));
  }